

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateAbsStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  LogicalType *pLVar1;
  BoundFunctionExpression *pBVar2;
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar3;
  reference stats_00;
  ulong uVar4;
  ulong uVar5;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *__u;
  ulong value;
  ulong value_00;
  BaseStatistics stats;
  LogicalType local_128;
  LogicalType local_110;
  LogicalType local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  Value new_max;
  Value new_min;
  
  pBVar2 = input->expr;
  this_00 = input->child_stats;
  stats_00 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&new_min,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  LogicalType::LogicalType(&local_e0,SQLNULL);
  Value::Value(&new_max,&local_e0);
  LogicalType::~LogicalType(&local_e0);
  bVar3 = NumericStats::HasMinMax(stats_00);
  if (bVar3) {
    switch((pBVar2->super_Expression).return_type.physical_type_) {
    case INT8:
      NumericStats::Min((Value *)&stats,stats_00);
      Value::GetValue<signed_char>((Value *)&stats);
      Value::~Value((Value *)&stats);
      break;
    default:
      *(undefined8 *)this = 0;
      goto LAB_01d1cc66;
    case INT16:
      NumericStats::Min((Value *)&stats,stats_00);
      Value::GetValue<short>((Value *)&stats);
      Value::~Value((Value *)&stats);
      break;
    case INT32:
      NumericStats::Min((Value *)&stats,stats_00);
      Value::GetValue<int>((Value *)&stats);
      Value::~Value((Value *)&stats);
      break;
    case INT64:
      NumericStats::Min((Value *)&stats,stats_00);
      Value::GetValue<long>((Value *)&stats);
      Value::~Value((Value *)&stats);
    }
    NumericStats::Min((Value *)&stats,stats_00);
    uVar4 = Value::GetValue<long>((Value *)&stats);
    Value::~Value((Value *)&stats);
    NumericStats::Max((Value *)&stats,stats_00);
    uVar5 = Value::GetValue<long>((Value *)&stats);
    Value::~Value((Value *)&stats);
    if ((long)(uVar5 & uVar4) < 0) {
      value = -uVar5;
      if (0 < (long)uVar5) {
        value = uVar5;
      }
      value_00 = -uVar4;
      if (0 < (long)uVar4) {
        value_00 = uVar4;
      }
    }
    else {
      if (-1 < (long)uVar4) {
        __u = (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&input->expr->children,0);
        ::std::__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::
        operator=((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                  input->expr_ptr,__u);
        vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
        BaseStatistics::ToUnique((BaseStatistics *)this);
        goto LAB_01d1cc66;
      }
      value_00 = -uVar4;
      if (-uVar5 == uVar4 || (long)-uVar4 < (long)uVar5) {
        value_00 = uVar5;
      }
      value = 0;
    }
    pLVar1 = &(pBVar2->super_Expression).return_type;
    Value::Numeric((Value *)&stats,pLVar1,value);
    Value::operator=(&new_min,(Value *)&stats);
    Value::~Value((Value *)&stats);
    Value::Numeric((Value *)&stats,pLVar1,value_00);
    Value::operator=(&new_max,(Value *)&stats);
    Value::~Value((Value *)&stats);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>((scalar_function_t *)&stats,pLVar1);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&(pBVar2->function).function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &stats);
    ::std::_Function_base::~_Function_base((_Function_base *)&stats);
  }
  else {
    pLVar1 = &(pBVar2->super_Expression).return_type;
    LogicalType::LogicalType(&local_f8,pLVar1);
    Value::Value((Value *)&stats,&local_f8);
    Value::operator=(&new_min,(Value *)&stats);
    Value::~Value((Value *)&stats);
    LogicalType::~LogicalType(&local_f8);
    LogicalType::LogicalType(&local_110,pLVar1);
    Value::Value((Value *)&stats,&local_110);
    Value::operator=(&new_max,(Value *)&stats);
    Value::~Value((Value *)&stats);
    LogicalType::~LogicalType(&local_110);
  }
  LogicalType::LogicalType(&local_128,&(pBVar2->super_Expression).return_type);
  NumericStats::CreateEmpty(&stats,&local_128);
  LogicalType::~LogicalType(&local_128);
  NumericStats::SetMin(&stats,&new_min);
  NumericStats::SetMax(&stats,&new_max);
  BaseStatistics::CopyValidity(&stats,stats_00);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&stats);
LAB_01d1cc66:
  Value::~Value(&new_max);
  Value::~Value(&new_min);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateAbsStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 1);
	// can only propagate stats if the children have stats
	auto &lstats = child_stats[0];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(lstats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow = NumericStats::Min(lstats).GetValue<int8_t>() == NumericLimits<int8_t>::Minimum();
			break;
		case PhysicalType::INT16:
			potential_overflow = NumericStats::Min(lstats).GetValue<int16_t>() == NumericLimits<int16_t>::Minimum();
			break;
		case PhysicalType::INT32:
			potential_overflow = NumericStats::Min(lstats).GetValue<int32_t>() == NumericLimits<int32_t>::Minimum();
			break;
		case PhysicalType::INT64:
			potential_overflow = NumericStats::Min(lstats).GetValue<int64_t>() == NumericLimits<int64_t>::Minimum();
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	} else {
		// no potential overflow

		// compute stats
		auto current_min = NumericStats::Min(lstats).GetValue<int64_t>();
		auto current_max = NumericStats::Max(lstats).GetValue<int64_t>();

		int64_t min_val, max_val;

		if (current_min < 0 && current_max < 0) {
			// if both min and max are below zero, then min=abs(cur_max) and max=abs(cur_min)
			min_val = AbsValue(current_max);
			max_val = AbsValue(current_min);
		} else if (current_min < 0) {
			D_ASSERT(current_max >= 0);
			// if min is below zero and max is above 0, then min=0 and max=max(cur_max, abs(cur_min))
			min_val = 0;
			max_val = MaxValue(AbsValue(current_min), current_max);
		} else {
			// if both current_min and current_max are > 0, then the abs is a no-op and can be removed entirely
			*input.expr_ptr = std::move(input.expr.children[0]);
			return child_stats[0].ToUnique();
		}
		new_min = Value::Numeric(expr.return_type, min_val);
		new_max = Value::Numeric(expr.return_type, max_val);
		expr.function.function = ScalarFunction::GetScalarUnaryFunction<AbsOperator>(expr.return_type);
	}
	auto stats = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(stats, new_min);
	NumericStats::SetMax(stats, new_max);
	stats.CopyValidity(lstats);
	return stats.ToUnique();
}